

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::MemGrow(w3Interp *this)

{
  uint32_t uVar1;
  long lVar2;
  value_type_conflict2 local_19;
  
  lVar2 = (long)(this->module_instance->memory).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->module_instance->memory).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar1 = w3Stack::pop_u32(&this->super_w3Stack);
  if (uVar1 != 0) {
    local_19 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->module_instance->memory,(ulong)uVar1 * 0x10000 + lVar2,&local_19);
  }
  w3Stack::push_i32(&this->super_w3Stack,(int32_t)((ulong)lVar2 >> 0x10));
  return;
}

Assistant:

INTERP (MemGrow)
{
    //__debugbreak ();
    int32_t result = -1;
    const size_t previous_size = module_instance->memory.size ();
    const size_t page_growth = pop_u32 ();
    if (page_growth == 0)
    {
        result = (int32_t)(previous_size >> PageShift);
    }
    else
    {
        const size_t new_size = previous_size + (page_growth << PageShift);
        try
        {
            module_instance->memory.resize (new_size, 0);
            result = (int32_t)(previous_size >> PageShift);
        }
        catch (...)
        {
        }
    }
    push_i32 (result);
}